

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

Debug * __thiscall Corrade::Utility::Debug::print<char[8]>(Debug *this,char (*value) [8])

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  Error local_48;
  
  poVar2 = this->_output;
  if (poVar2 != (ostream *)0x0) {
    __s = this->_sourceLocationFile;
    if (__s != (char *)0x0) {
      if (((this->_immediateFlags)._value & 4) == 0) {
        Error::Error(&local_48,(ostream *)&std::cerr,(Flags)0x0);
        operator<<(&local_48.super_Debug,
                   "Assertion _immediateFlags & Flag::NoSpace failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Debug.cpp:700"
                  );
        Error::~Error(&local_48);
        abort();
      }
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_sourceLocationLine);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      this->_sourceLocationFile = (char *)0x0;
      poVar2 = this->_output;
    }
    if ((((this->_immediateFlags)._value | (this->_flags)._value) & 4) == 0) {
      local_48.super_Debug._output._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
      poVar2 = this->_output;
    }
    sVar1 = strlen(*value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,*value,sVar1);
    (this->_immediateFlags)._value = '\0';
    (this->_internalFlags)._value = (this->_internalFlags)._value | 2;
  }
  return this;
}

Assistant:

Debug& Debug::print(const T& value) {
    if(!_output) return *this;

    #ifdef CORRADE_SOURCE_LOCATION_BUILTINS_SUPPORTED
    /* Print source location, if not printed yet */
    if(_sourceLocationFile) {
        CORRADE_INTERNAL_ASSERT(_immediateFlags & Flag::NoSpace);
        *_output << _sourceLocationFile << ":" << _sourceLocationLine << ": ";
        _sourceLocationFile = nullptr;
    }
    #endif

    /* Separate values with spaces if enabled */
    if(!((_immediateFlags|_flags) & Flag::NoSpace))
        *_output << ' ';
    /* Print the next value as hexadecimal if enabled */
    /** @todo this does strange crap for negative values (printing them as
        unsigned), revisit once iostreams are not used anymore */
    if(((_immediateFlags|_flags) & Flag::Hex) && std::is_integral<T>::value)
        *_output << "0x" << std::hex;

    toStream(*_output, value);

    /* Reset the hexadecimal printing back if it was enabled */
    if(((_immediateFlags|_flags) & Flag::Hex) && std::is_integral<T>::value)
        *_output << std::dec;

    /* Reset all immediate flags after */
    _immediateFlags = {};

    _internalFlags |= InternalFlag::ValueWritten;
    return *this;
}